

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O0

filepos_t MemSeek(memstream *p,filepos_t VirtualPos,int SeekMode)

{
  filepos_t fStack_18;
  int SeekMode_local;
  filepos_t VirtualPos_local;
  memstream *p_local;
  
  fStack_18 = VirtualPos;
  if (SeekMode != 0) {
    if (SeekMode == 1) {
      fStack_18 = p->Pos + p->VirtualOffset + VirtualPos;
    }
    else if (SeekMode == 2) {
      fStack_18 = p->Size + p->VirtualOffset + VirtualPos;
    }
  }
  if (fStack_18 < 0) {
    if (fStack_18 < 0) {
      __assert_fail("VirtualPos>=0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/memstream.c"
                    ,0x44,"filepos_t MemSeek(memstream *, filepos_t, int)");
    }
    fStack_18 = 0;
  }
  if ((long)(p->Size + p->VirtualOffset) < fStack_18) {
    if ((long)p->Size < fStack_18) {
      __assert_fail("VirtualPos<=(filepos_t)p->Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/memstream.c"
                    ,0x4a,"filepos_t MemSeek(memstream *, filepos_t, int)");
    }
    fStack_18 = p->Size + p->VirtualOffset;
  }
  p->Pos = fStack_18 - p->VirtualOffset;
  return fStack_18;
}

Assistant:

static filepos_t MemSeek(memstream* p,filepos_t VirtualPos,int SeekMode)
{
    switch (SeekMode)
    {
    default:
    case SEEK_SET: break;
    case SEEK_CUR: VirtualPos += p->Pos + p->VirtualOffset; break;
    case SEEK_END: VirtualPos += p->Size + p->VirtualOffset; break;
    }

    // TODO: these safety checks should return an error
    if (VirtualPos<0)
    {
        assert(VirtualPos>=0);
        VirtualPos=0;
    }

    if (VirtualPos>(filepos_t)p->Size + p->VirtualOffset)
    {
        assert(VirtualPos<=(filepos_t)p->Size);
        VirtualPos=p->Size + p->VirtualOffset;
    }

    p->Pos = (size_t)(VirtualPos - p->VirtualOffset);
    return VirtualPos;
}